

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool __thiscall cmGlobalGenerator::FindMakeProgram(cmGlobalGenerator *this,cmMakefile *mf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  bool bVar4;
  char *pcVar5;
  ostream *poVar6;
  string *psVar7;
  long lVar8;
  string dir;
  string file;
  string saveFile;
  bool system;
  string makeProgram;
  string local_268;
  string local_248;
  long *local_228 [2];
  long local_218 [2];
  string local_208;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  if ((this->FindMakeProgramFile)._M_string_length == 0) {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,
               "Generator implementation error, all generators must specify this->FindMakeProgramFile"
               ,"");
    cmSystemTools::Error((string *)local_1a8);
    if ((char *)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MAKE_PROGRAM","");
    pcVar5 = cmMakefile::GetDefinition(mf,(string *)local_1a8);
    if (pcVar5 == (char *)0x0) {
      bVar4 = true;
    }
    else {
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1c8,"CMAKE_MAKE_PROGRAM","");
      pcVar5 = cmMakefile::GetDefinition(mf,&local_1c8);
      bVar4 = cmSystemTools::IsOff(pcVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char *)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4 != false) {
      cmMakefile::GetModulesFile
                ((string *)local_1a8,mf,&this->FindMakeProgramFile,(bool *)&local_208);
      if (local_1a8._8_8_ != 0) {
        cmMakefile::ReadListFile(mf,(string *)local_1a8);
      }
      if ((char *)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CMAKE_MAKE_PROGRAM","");
    pcVar5 = cmMakefile::GetDefinition(mf,(string *)local_1a8);
    if (pcVar5 == (char *)0x0) {
      bVar4 = true;
    }
    else {
      local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"CMAKE_MAKE_PROGRAM","");
      pcVar5 = cmMakefile::GetDefinition(mf,&local_208);
      bVar4 = cmSystemTools::IsOff(pcVar5);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != &local_208.field_2) {
        operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
      }
    }
    if ((char *)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar4 == false) {
      paVar1 = &local_268.field_2;
      local_268._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"CMAKE_MAKE_PROGRAM","");
      psVar7 = cmMakefile::GetRequiredDefinition(mf,&local_268);
      pcVar3 = (psVar7->_M_dataplus)._M_p;
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1a8,pcVar3,pcVar3 + psVar7->_M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != paVar1) {
        operator_delete(local_268._M_dataplus._M_p,
                        CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                 local_268.field_2._M_local_buf[0]) + 1);
      }
      lVar8 = std::__cxx11::string::find((char)local_1a8,0x20);
      if (lVar8 != -1) {
        local_268._M_string_length = 0;
        local_268.field_2._M_local_buf[0] = '\0';
        local_248._M_string_length = 0;
        local_248.field_2._M_local_buf[0] = '\0';
        local_268._M_dataplus._M_p = (pointer)paVar1;
        local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
        cmsys::SystemTools::SplitProgramPath((string *)local_1a8,&local_268,&local_248,true);
        local_228[0] = local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_228,local_248._M_dataplus._M_p,
                   local_248._M_dataplus._M_p + local_248._M_string_length);
        cmsys::SystemTools::GetShortPath((string *)local_1a8,(string *)local_1a8);
        cmsys::SystemTools::SplitProgramPath((string *)local_1a8,&local_268,&local_248,true);
        std::__cxx11::string::_M_assign((string *)local_1a8);
        std::__cxx11::string::append(local_1a8);
        std::__cxx11::string::_M_append(local_1a8,(ulong)local_228[0]);
        local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1e8,"CMAKE_MAKE_PROGRAM","");
        cmMakefile::AddCacheDefinition
                  (mf,&local_1e8,(char *)local_1a8._0_8_,"make program",FILEPATH,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
        if (local_228[0] != local_218) {
          operator_delete(local_228[0],local_218[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,
                          CONCAT71(local_248.field_2._M_allocated_capacity._1_7_,
                                   local_248.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar1) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((char *)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      return true;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"CMake was unable to find a build program corresponding to \"",
               0x3b);
    (*this->_vptr_cmGlobalGenerator[3])(&local_268,this);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_268._M_dataplus._M_p,local_268._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"\".  CMAKE_MAKE_PROGRAM is not set.  You ",0x28);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar6,"probably need to select a different build tool.",0x2f);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Error(&local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p,
                      CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                               local_268.field_2._M_local_buf[0]) + 1);
    }
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return false;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}